

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * Path::relpath(string *__return_storage_ptr__,string *base,string *path)

{
  string sStack_38;
  
  basedir(&sStack_38,base);
  join(__return_storage_ptr__,&sStack_38,path);
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

string relpath(const string &base, const string &path)
{
	return Path::join(basedir(base), path);
}